

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O0

wpe_input_xkb_context * wpe_input_xkb_context_get_default(void)

{
  xkb_context *pxVar1;
  xkb_context *context;
  
  if ((wpe_input_xkb_context_get_default::s_xkb_context == (wpe_input_xkb_context *)0x0) &&
     (pxVar1 = (xkb_context *)xkb_context_new(0), pxVar1 != (xkb_context *)0x0)) {
    wpe_input_xkb_context_get_default::s_xkb_context =
         (wpe_input_xkb_context *)
         wpe_calloc_impl(1,0x18,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/input-xkb.c"
                         ,0x33);
    wpe_input_xkb_context_get_default::s_xkb_context->context = pxVar1;
  }
  return wpe_input_xkb_context_get_default::s_xkb_context;
}

Assistant:

struct wpe_input_xkb_context*
wpe_input_xkb_context_get_default()
{
    static struct wpe_input_xkb_context* s_xkb_context = NULL;
    if (!s_xkb_context) {
        struct xkb_context* context = xkb_context_new(XKB_CONTEXT_NO_FLAGS);
        if (context) {
            s_xkb_context = wpe_calloc(1, sizeof(struct wpe_input_xkb_context));
            s_xkb_context->context = context;
        }
    }

    return s_xkb_context;
}